

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qchar.cpp
# Opt level: O0

R_conflict14 fullConvertCase(char32_t uc,Case which)

{
  undefined1 uVar1;
  Properties *pPVar2;
  char16_t *pcVar3;
  long lVar4;
  char16_t *extraout_RDX;
  char16_t *extraout_RDX_00;
  char16_t *pcVar5;
  uint in_ESI;
  char32_t in_EDI;
  long in_FS_OFFSET;
  R_conflict14 RVar6;
  char16_t c;
  char16_t *__end2;
  char16_t *__begin2;
  R_conflict4 *__range2;
  unsigned_short length;
  unsigned_short *specialCase;
  short caseDiff;
  char16_t *pp;
  anon_struct_2_2_b36fdad7 fold;
  R_conflict14 result;
  char32_t in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  char16_t *local_60;
  short local_4a;
  char16_t *local_48;
  char16_t *local_38;
  char16_t local_16 [2];
  char16_t local_12 [4];
  undefined2 local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_12 = (char16_t  [4])&DAT_aaaaaaaaaaaaaaaa;
  local_a = 0xaaaa;
  pPVar2 = QUnicodeTables::qGetProp(in_EDI);
  local_38 = local_12;
  if (((ushort)pPVar2->cases[in_ESI] & 1) == 0) {
    local_16 = (char16_t  [2])QChar::fromUcs4(in_stack_ffffffffffffff78);
    local_60 = R::begin((R *)local_16);
    pcVar3 = R::end((R_conflict4 *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    pcVar5 = extraout_RDX_00;
    for (; local_60 != pcVar3; local_60 = local_60 + 1) {
      pcVar5 = local_38 + 1;
      *local_38 = *local_60;
      local_38 = pcVar5;
    }
  }
  else {
    lVar4 = (long)(int)((short)pPVar2->cases[in_ESI] >> 1) * 2;
    pcVar5 = extraout_RDX;
    local_4a = *(short *)(QUnicodeTables::specialCaseMap + lVar4);
    local_48 = (char16_t *)(QUnicodeTables::specialCaseMap + lVar4 + 2);
    while( true ) {
      if (local_4a == 0) break;
      pcVar5 = local_38 + 1;
      *local_38 = *local_48;
      local_4a = local_4a + -1;
      local_48 = local_48 + 1;
      local_38 = pcVar5;
    }
  }
  uVar1 = (undefined1)((uint)((int)local_38 - (int)local_12) >> 1);
  local_a = CONCAT11(local_a._1_1_,uVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  RVar6._8_2_ = (undefined2)CONCAT71((int7)((ulong)pcVar5 >> 8),uVar1);
  RVar6.chars[0] = local_12[0];
  RVar6.chars[1] = local_12[1];
  RVar6.chars[2] = local_12[2];
  RVar6.chars[3] = local_12[3];
  return RVar6;
}

Assistant:

static auto fullConvertCase(char32_t uc, QUnicodeTables::Case which) noexcept
{
    struct R {
        char16_t chars[MaxSpecialCaseLength + 1];
        qint8 sz;

        // iterable
        auto begin() const { return chars; }
        auto end() const { return chars + sz; }
        // QStringView-compatible
        auto data() const { return chars; }
        auto size() const { return sz; }
    } result;
    Q_ASSERT(uc <= QChar::LastValidCodePoint);

    auto pp = result.chars;

    const auto fold = qGetProp(uc)->cases[which];
    const auto caseDiff = fold.diff;

    if (Q_UNLIKELY(fold.special)) {
        const auto *specialCase = specialCaseMap + caseDiff;
        auto length = *specialCase++;
        while (length--)
            *pp++ = *specialCase++;
    } else {
        // so far, case conversion never changes planes (guaranteed by the qunicodetables generator)
        for (char16_t c : QChar::fromUcs4(uc + caseDiff))
            *pp++ = c;
    }
    result.sz = pp - result.chars;
    return result;
}